

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::error_already_set::error_already_set(error_already_set *this)

{
  PyObject **ppPVar1;
  PyObject **ppPVar2;
  PyObject **ppPVar3;
  string local_30 [32];
  error_already_set *local_10;
  error_already_set *this_local;
  
  local_10 = this;
  detail::error_string_abi_cxx11_();
  std::runtime_error::runtime_error(&this->super_runtime_error,local_30);
  std::__cxx11::string::~string(local_30);
  *(undefined ***)this = &PTR__error_already_set_001aaa68;
  object::object(&this->m_type);
  object::object(&this->m_value);
  object::object(&this->m_trace);
  ppPVar1 = handle::ptr(&(this->m_type).super_handle);
  ppPVar2 = handle::ptr(&(this->m_value).super_handle);
  ppPVar3 = handle::ptr(&(this->m_trace).super_handle);
  PyErr_Fetch(ppPVar1,ppPVar2,ppPVar3);
  return;
}

Assistant:

error_already_set() : std::runtime_error(detail::error_string()) {
        PyErr_Fetch(&m_type.ptr(), &m_value.ptr(), &m_trace.ptr());
    }